

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O2

void __thiscall
miniros::Publisher::Publisher
          (Publisher *this,string *topic,string *md5sum,string *datatype,NodeHandle *node_handle,
          SubscriberCallbacksPtr *callbacks)

{
  std::make_shared<miniros::Publisher::Impl>();
  std::__cxx11::string::_M_assign
            ((string *)
             (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->impl_).
               super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              md5sum_);
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->impl_).
               super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              datatype_);
  std::make_shared<miniros::NodeHandle,miniros::NodeHandle_const&>
            ((NodeHandle *)&stack0xffffffffffffffc0);
  std::__shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->impl_).
                super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              node_handle_).super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffc0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  std::__shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->impl_).
                super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              callbacks_).
              super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>,
             &callbacks->
              super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

Publisher::Publisher(const std::string& topic, const std::string& md5sum, const std::string& datatype, const NodeHandle& node_handle, const SubscriberCallbacksPtr& callbacks)
: impl_(std::make_shared<Impl>())
{
  impl_->topic_ = topic;
  impl_->md5sum_ = md5sum;
  impl_->datatype_ = datatype;
  impl_->node_handle_ = std::make_shared<NodeHandle>(node_handle);
  impl_->callbacks_ = callbacks;
}